

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec.c
# Opt level: O3

fec_t * fec_new(uint k,uint n)

{
  ulong uVar1;
  fec_t *pfVar2;
  gf *pgVar3;
  ulong uVar4;
  gf *pgVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  gf *a;
  code *pcStack_40;
  undefined8 local_38;
  
  uVar1 = (ulong)k;
  if (fec_new_gf_initialized == '\0') {
    pcStack_40 = (code *)0x105dc7;
    gf_init();
    fec_new_gf_initialized = '\x01';
  }
  pcStack_40 = (code *)0x105dd8;
  pfVar2 = (fec_t *)malloc(0x10);
  if (pfVar2 != (fec_t *)0x0) {
    pcStack_40 = (code *)0x105df3;
    pgVar3 = (gf *)malloc(n * uVar1);
    pfVar2->gen_matrix = pgVar3;
    if (pgVar3 != (gf *)0x0) {
      pfVar2->k = k;
      pfVar2->n = n;
      uVar4 = (ulong)(n * k) + 0xf & 0xfffffffffffffff0;
      lVar7 = -uVar4;
      a = (gf *)((long)&local_38 + lVar7);
      local_38 = pfVar2;
      *(undefined1 *)((long)&local_38 - uVar4) = 1;
      if (1 < k) {
        *(undefined8 *)((long)&pcStack_40 + lVar7) = 0x105e43;
        memset((void *)((long)&local_38 + lVar7 + 1),0,(ulong)(k - 1));
      }
      if (n != 1) {
        iVar6 = 0;
        pgVar5 = a;
        do {
          pgVar5 = pgVar5 + uVar1;
          if (k != 0) {
            uVar4 = 0;
            uVar8 = 0;
            do {
              pgVar5[uVar8] = gf_polys[(uint)((int)(uVar4 / 0xff) * -0xff + (int)uVar4)];
              uVar8 = uVar8 + 1;
              uVar4 = (ulong)(uint)((int)uVar4 + iVar6);
            } while (uVar1 != uVar8);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != n - 1);
      }
      *(undefined8 *)((long)&pcStack_40 + lVar7) = 0x105ea4;
      matrix_inv_vandermonde(a,k);
      *(undefined8 *)((long)&pcStack_40 + lVar7) = 0x105ec4;
      matrix_mul(a + k * k,a,pgVar3 + k * k,n - k,k,k);
      if (k != 0) {
        lVar7 = 0;
        uVar4 = 0;
        do {
          uVar8 = 0;
          do {
            if (uVar4 == uVar8) {
              pgVar3[(int)uVar4 * k + (int)uVar4] = '\x01';
            }
            else {
              pgVar3[(uint)((int)lVar7 + (int)uVar8)] = '\0';
            }
            uVar8 = uVar8 + 1;
          } while (uVar1 != uVar8);
          uVar4 = uVar4 + 1;
          lVar7 = lVar7 + uVar1;
        } while (uVar4 != uVar1);
      }
      return local_38;
    }
    pcStack_40 = fec_encode;
    __assert_fail("res->gen_matrix != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",0x32,
                  "fec_t *fec_new(unsigned int, unsigned int)");
  }
  pcStack_40 = (code *)0x105f30;
  __assert_fail("res != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec.c",
                0x30,"fec_t *fec_new(unsigned int, unsigned int)");
}

Assistant:

fec_t *fec_new(unsigned int k, unsigned int n) {
  assert((k <= n ) || "k is too big");
  assert((k <= 256) || "k is too big");
  assert((n <= 256) || "n is too big");

  /*M
    Init Galois arithmetic if not already initialized.
  **/
  static int gf_initialized = 0;
  if (!gf_initialized) {
    gf_init();
    gf_initialized = 1;
  }

  fec_t *res;
  res = malloc(sizeof(fec_t));
  assert(res != NULL);
  res->gen_matrix = malloc(sizeof(gf)*k*n);
  assert(res->gen_matrix != NULL);

  res->k = k;
  res->n = n;

  /*M
    Fill the matrix with powers of field elements.
  **/
  gf tmp[k*n];
  /*  gf *tmp = res->gen_matrix; */

  /*M
    First row is special (powers of $0$).
  **/
  tmp[0] = 1;
  unsigned int col;
  for (col = 1; col < k; col++)
    tmp[col] = 0;
  
  gf *p;
  unsigned int row;
  for (p = tmp + k, row = 0; row < n - 1; row++, p += k) {
    for (col = 0; col < k; col++)
      p[col] = gf_polys[(row * col) % 255];
  }

#ifdef DEBUG
  fprintf(stderr, "first vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Invert the upper $k \times k$ vandermonde matrix.
  **/
  matrix_inv_vandermonde(tmp, k);

#ifdef DEBUG
  fprintf(stderr, "\ninverted vandermonde matrix\n");
  matrix_print(tmp, res->n, res->k);
#endif

  /*M
    Multiply the inverted upper $k \times k$ vandermonde matrix with
    the lower band of the matrix.
  **/
  matrix_mul(tmp + k * k, tmp, res->gen_matrix + k * k, n - k, k, k);

  /*M
    Fill the upper $k \times k$ matrix with the identity matrix to
    generate a systematic matrix.
  **/
  for (row = 0; row < k; row++)
    for (col = 0; col < k; col++)
      if (col == row)
        res->gen_matrix[row * k + col] = 1;
      else
        res->gen_matrix[row * k + col] = 0;

#ifdef DEBUG
  fprintf(stderr, "\ngenerated matrix\n");
  matrix_print(res->gen_matrix, res->n, res->k);
#endif
  
  return res;
}